

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O2

tuple<unsigned_long,_unsigned_long,_unsigned_long> *
qclab::qgates::masks
          (tuple<unsigned_long,_unsigned_long,_unsigned_long> *__return_storage_ptr__,int nbQubits,
          int qubit0,int qubit1)

{
  byte bVar1;
  byte bVar2;
  char *__assertion;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/apply.hpp"
                  ,0xf5,
                  "std::tuple<uint64_t, uint64_t, uint64_t> qclab::qgates::masks(const int, const int, const int)"
                 );
  }
  if (qubit0 < nbQubits) {
    if (qubit1 < nbQubits) {
      bVar2 = ~(byte)qubit0 + (byte)qubit1;
      bVar1 = ~(byte)qubit1 + (char)nbQubits;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
      super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<2UL,_unsigned_long>.
      super__Head_base<2UL,_unsigned_long,_false>._M_head_impl = ~(-1L << (bVar1 & 0x3f));
      (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
      super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
           ~(-1L << (bVar2 & 0x3f)) << (bVar1 & 0x3f);
      (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (-1L << ((byte)qubit0 & 0x3f) ^ 0xffffffffffffffffU) << (bVar1 + bVar2 & 0x3f);
      return __return_storage_ptr__;
    }
    __assertion = "qubit1 < nbQubits";
  }
  else {
    __assertion = "qubit0 < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/apply.hpp"
                ,0xf6,
                "std::tuple<uint64_t, uint64_t, uint64_t> qclab::qgates::masks(const int, const int, const int)"
               );
}

Assistant:

inline
  std::tuple< uint64_t , uint64_t , uint64_t > masks( const int nbQubits ,
                                                      const int qubit0 ,
                                                      const int qubit1 ) {
    assert( nbQubits >= 2 ) ;
    assert( qubit0 < nbQubits ) ; assert( qubit1 < nbQubits ) ;
    // mask lengths
    const int nL = qubit0 ;
    const int nC = qubit1 - qubit0 - 1 ;
    const int nR = nbQubits - qubit1 - 1 ;
    // masks
    const uint64_t mL = ( ( 1ULL << nL ) - 1 ) << ( nR + nC ) ;
    const uint64_t mC = ( ( 1ULL << nC ) - 1 ) <<   nR ;
    const uint64_t mR =   ( 1ULL << nR ) - 1 ;
    return { mL , mC , mR } ;
  }